

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::~COpenGLCoreCacheHandler
          (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__COpenGLCoreCacheHandler_0043b858;
  if ((void *)in_RDI[10] != (void *)0x0) {
    operator_delete__((void *)in_RDI[10]);
  }
  if ((void *)in_RDI[0xb] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xb]);
  }
  if ((void *)in_RDI[0xc] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xc]);
  }
  if ((void *)in_RDI[0xd] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xd]);
  }
  if ((void *)in_RDI[0xe] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xe]);
  }
  if ((void *)in_RDI[0xf] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0xf]);
  }
  if ((void *)in_RDI[0x11] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x11]);
  }
  STextureCache::~STextureCache((STextureCache *)0x33873d);
  return;
}

Assistant:

virtual ~COpenGLCoreCacheHandler()
	{
		delete[] BlendEquation;
		delete[] BlendSourceRGB;
		delete[] BlendDestinationRGB;
		delete[] BlendSourceAlpha;
		delete[] BlendDestinationAlpha;
		delete[] Blend;

		delete[] ColorMask;
	}